

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O0

uint64_t helper_iwmmxt_shufh_aarch64(CPUARMState_conflict *env,uint64_t x,uint32_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t n_local;
  uint64_t x_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = x >> (sbyte)((n & 3) << 4);
  uVar2 = uVar1 & 0xffff;
  uVar3 = x >> (sbyte)((n & 0xc) << 2) & 0xffff;
  uVar4 = uVar3 << 0x10;
  uVar5 = x >> ((byte)n & 0x30) & 0xffff;
  uVar6 = uVar5 << 0x20;
  uVar8 = x >> ((byte)(n >> 2) & 0x30);
  uVar7 = uVar8 << 0x30;
  (env->iwmmxt).cregs[3] =
       (uint)((uVar1 & 0x8000) != 0) << 7 | (uint)(uVar2 == 0) << 6 |
       (uint)((uVar4 & 0x80000000) != 0) << 0xf | (uint)(uVar3 == 0) << 0xe |
       (uint)((uVar6 & 0x800000000000) != 0) << 0x17 | (uint)(uVar5 == 0) << 0x16 |
       (uint)((uVar7 & 0x8000000000000000) != 0) << 0x1f | (uint)((uVar8 & 0xffff) == 0) << 0x1e;
  return uVar2 | uVar4 | uVar6 | uVar7;
}

Assistant:

uint64_t HELPER(iwmmxt_shufh)(CPUARMState *env, uint64_t x, uint32_t n)
{
    x = (((x >> ((n << 4) & 0x30)) & 0xffff) << 0) |
        (((x >> ((n << 2) & 0x30)) & 0xffff) << 16) |
        (((x >> ((n << 0) & 0x30)) & 0xffff) << 32) |
        (((x >> ((n >> 2) & 0x30)) & 0xffff) << 48);
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT16(x >> 0, 0) | NZBIT16(x >> 16, 1) |
        NZBIT16(x >> 32, 2) | NZBIT16(x >> 48, 3);
    return x;
}